

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,void **vtt
          ,int64_t globalsize)

{
  void *in_RDX;
  TPZFrontSym<double> *in_RSI;
  void **in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  void **GlobalSize;
  TPZAbstractFrontMatrix<double> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffd0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = (in_RSI->super_TPZFront<double>).super_TPZSavable._vptr_TPZSavable;
  TPZStackEqnStorage<double>::TPZStackEqnStorage((TPZStackEqnStorage<double> *)(in_RDI + 4));
  GlobalSize = in_RDI + 0x3f3d;
  TPZFrontSym<double>::TPZFrontSym(in_RSI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x3f64));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x3f68));
  TPZFrontSym<double>::Reset(in_RSI,(int64_t)GlobalSize);
  TPZStackEqnStorage<double>::Reset((TPZStackEqnStorage<double> *)0x1cdab75);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x3f63] = (void *)0xffffffffffffffff;
  in_RDI[0x3f62] = in_RDX;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}